

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O0

Wrapper_Holder __thiscall
OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
          (Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this,Name_Num *aKey)

{
  bool bVar1;
  reference ppVar2;
  key_type *in_RDX;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Name_Num *aKey_local;
  Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
       ::find((map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
               *)aKey,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
       ::end((map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
              *)aKey);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Name_Num,_Wrapper_Holder>_>::operator*
                       (&local_28);
    Wrapper_Holder::Wrapper_Holder((Wrapper_Holder *)this,&ppVar2->second);
  }
  else {
    Wrapper_Holder::Wrapper_Holder((Wrapper_Holder *)this,(Wrapper_Holder *)(aKey + 3));
  }
  return (Wrapper_Holder)(Am_Wrapper *)this;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }